

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest07KeyUsage_::
DISABLED_Section7InvalidkeyUsageCriticalcRLSignFalseTest4<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(DISABLED_Section7InvalidkeyUsageCriticalcRLSignFalseTest4<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.7.4";
  local_88.should_validate = false;
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005b4980,(char *(*) [3])&PTR_anon_var_dwarf_28895f_005b49a0,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest07KeyUsage,
                     Section7InvalidkeyUsageCriticalcRLSignFalseTest4) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "keyUsageCriticalcRLSignFalseCACert",
                               "InvalidkeyUsageCriticalcRLSignFalseTest4EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "keyUsageCriticalcRLSignFalseCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.7.4";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}